

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
opengv::math::o4_roots(vector<double,_std::allocator<double>_> *p)

{
  const_reference pvVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> *this;
  undefined8 uVar7;
  complex<double> temp;
  complex<double> w;
  complex<double> y;
  complex<double> U;
  complex<double> R;
  complex<double> Q;
  complex<double> P;
  double alpha_pw3;
  double alpha_pw2;
  double gamma;
  double beta;
  double alpha;
  double B_pw4;
  double A_pw4;
  double B_pw3;
  double A_pw3;
  double B_pw2;
  double A_pw2;
  double E;
  double D;
  double C;
  double B;
  double A;
  vector<double,_std::allocator<double>_> *realRoots;
  complex<double> *in_stack_fffffffffffff7c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff7d0;
  complex<double> *in_stack_fffffffffffff7e0;
  double *in_stack_fffffffffffff7f8;
  complex<double> *in_stack_fffffffffffff800;
  double local_268 [3];
  undefined1 local_249;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  double local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  double local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  complex<double> local_190;
  undefined8 local_180;
  complex<double> local_178;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  double local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  complex<double> local_b0;
  complex<double> local_a0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  value_type local_28;
  value_type local_20;
  value_type local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  local_18 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  local_20 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
  local_28 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,3);
  local_30 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,4);
  local_38 = *pvVar1;
  local_40 = local_18 * local_18;
  local_48 = local_20 * local_20;
  local_50 = local_40 * local_18;
  local_58 = local_48 * local_20;
  local_60 = local_50 * local_18;
  local_68 = local_58 * local_20;
  local_70 = (local_48 * -3.0) / (local_40 * 8.0) + local_28 / local_18;
  local_78 = (local_58 / (local_50 * 8.0) - (local_20 * local_28) / (local_40 * 2.0)) +
             local_30 / local_18;
  local_80 = (((local_68 * -3.0) / (local_60 * 256.0) + (local_48 * local_28) / (local_50 * 16.0)) -
             (local_20 * local_30) / (local_40 * 4.0)) + local_38 / local_18;
  local_88 = local_70 * local_70;
  local_90 = local_88 * local_70;
  std::complex<double>::complex(&local_a0,-local_88 / 12.0 - local_80,0.0);
  dVar2 = -local_90;
  dVar6 = local_70 * local_80;
  dVar3 = pow(local_78,2.0);
  dVar6 = (dVar2 / 108.0 + dVar6 / 3.0) - dVar3 / 8.0;
  uVar7 = 0;
  std::complex<double>::complex(&local_b0,dVar6,0.0);
  std::operator-(in_stack_fffffffffffff7e0);
  uVar4 = 0x4000000000000000;
  local_e8 = 0x4000000000000000;
  local_e0 = dVar6;
  local_d8 = uVar7;
  std::operator/(in_stack_fffffffffffff7c8,(double *)0xb0f6da);
  uVar5 = 0x4000000000000000;
  local_130 = 0x4000000000000000;
  local_d0 = uVar4;
  local_c8 = uVar7;
  std::pow<double>(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  uVar4 = 0x4010000000000000;
  local_138 = 0x4010000000000000;
  local_128 = uVar5;
  local_120 = uVar7;
  std::operator/(in_stack_fffffffffffff7c8,(double *)0xb0f74a);
  uVar5 = 0x4008000000000000;
  local_160 = 0x4008000000000000;
  local_118 = uVar4;
  local_110 = uVar7;
  std::pow<double>(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  uVar4 = 0x403b000000000000;
  local_168 = 0x403b000000000000;
  local_158 = uVar5;
  local_150 = uVar7;
  std::operator/(in_stack_fffffffffffff7c8,(double *)0xb0f7ba);
  local_148 = uVar4;
  local_140 = uVar7;
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0f7e1);
  local_108 = uVar4;
  local_100 = uVar7;
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  local_f8 = uVar4;
  local_f0 = uVar7;
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0f827);
  uVar5 = 0x3fd5555555555555;
  local_180 = 0x3fd5555555555555;
  local_c0 = uVar4;
  local_b8 = uVar7;
  std::pow<double>(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_178._M_value._0_8_ = uVar5;
  local_178._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_190,0.0,0.0);
  dVar6 = std::complex<double>::real_abi_cxx11_(&local_178);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    uVar5 = 0x4018000000000000;
    local_1e8 = (local_70 * -5.0) / 6.0;
    uVar4 = 0x4008000000000000;
    local_210 = 0x4008000000000000;
    std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0f99d);
    local_208 = uVar4;
    local_200 = uVar5;
    std::operator/(in_stack_fffffffffffff7c8,(complex<double> *)0xb0f9c4);
    local_1f8 = uVar4;
    local_1f0 = uVar5;
    std::operator-((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    local_1e0 = uVar4;
    local_1d8 = uVar5;
    std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0fa12);
    local_1d0 = uVar4;
    local_1c8 = uVar5;
  }
  else {
    uVar5 = 0x4018000000000000;
    local_1a8 = (local_70 * -5.0) / 6.0;
    uVar4 = 0x3fd5555555555555;
    local_1c0 = 0x3fd5555555555555;
    std::pow<double>(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    local_1b8 = uVar4;
    local_1b0 = uVar5;
    std::operator-((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    local_1a0 = uVar4;
    local_198 = uVar5;
  }
  local_248 = 0x4000000000000000;
  local_190._M_value._0_8_ = uVar4;
  local_190._M_value._8_8_ = uVar5;
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fa6b);
  local_240 = uVar4;
  local_238 = uVar5;
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fa92);
  local_230 = uVar4;
  local_228 = uVar5;
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  local_249 = 0;
  local_220 = uVar4;
  local_218 = uVar5;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xb0fad8);
  std::complex<double>::complex((complex<double> *)local_268,0.0,0.0);
  uVar4 = 0x4008000000000000;
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fb71);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fbbe);
  dVar6 = local_78 + local_78;
  std::operator/((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0fc6e);
  std::operator-(in_stack_fffffffffffff7e0);
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0fd45);
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fd92);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0fddf);
  local_268[0] = dVar6;
  local_268[1] = (double)uVar4;
  std::complex<double>::real_abi_cxx11_((complex<double> *)local_268);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffff7d0,(value_type_conflict1 *)in_stack_fffffffffffff7c8);
  uVar4 = 0x4008000000000000;
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0feec);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb0ff39);
  dVar6 = local_78 + local_78;
  std::operator/((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb0ffe9);
  std::operator-(in_stack_fffffffffffff7e0);
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  std::operator-(in_stack_fffffffffffff7c8,(complex<double> *)0xb100c0);
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb1010d);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb1015a);
  local_268[0] = dVar6;
  local_268[1] = (double)uVar4;
  std::complex<double>::real_abi_cxx11_((complex<double> *)local_268);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffff7d0,(value_type_conflict1 *)in_stack_fffffffffffff7c8);
  std::operator-(in_stack_fffffffffffff7e0);
  uVar4 = 0x4008000000000000;
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb102ac);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb102f9);
  dVar6 = local_78 + local_78;
  std::operator/((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator-(in_stack_fffffffffffff7c8,(complex<double> *)0xb103a9);
  std::operator-(in_stack_fffffffffffff7e0);
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  std::operator+(in_stack_fffffffffffff7c8,(complex<double> *)0xb10480);
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb104cd);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb1051a);
  local_268[0] = dVar6;
  local_268[1] = (double)uVar4;
  std::complex<double>::real_abi_cxx11_((complex<double> *)local_268);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffff7d0,(value_type_conflict1 *)in_stack_fffffffffffff7c8);
  std::operator-(in_stack_fffffffffffff7e0);
  uVar4 = 0x4008000000000000;
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb1066c);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb106b9);
  dVar6 = local_78 + local_78;
  std::operator/((double *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator-(in_stack_fffffffffffff7c8,(complex<double> *)0xb1075d);
  std::operator-(in_stack_fffffffffffff7e0);
  std::sqrt<double>(in_stack_fffffffffffff7e0);
  std::operator-(in_stack_fffffffffffff7c8,(complex<double> *)0xb10810);
  std::operator*((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb10851);
  std::operator+((double *)in_stack_fffffffffffff7c8,(complex<double> *)0xb10892);
  local_268[0] = dVar6;
  local_268[1] = (double)uVar4;
  this = (vector<double,_std::allocator<double>_> *)
         std::complex<double>::real_abi_cxx11_((complex<double> *)local_268);
  std::vector<double,_std::allocator<double>_>::push_back
            (this,(value_type_conflict1 *)in_stack_fffffffffffff7c8);
  return in_RDI;
}

Assistant:

std::vector<double>
opengv::math::o4_roots( const std::vector<double> & p )
{
  double A = p[0];
  double B = p[1];
  double C = p[2];
  double D = p[3];
  double E = p[4];

  double A_pw2 = A*A;
  double B_pw2 = B*B;
  double A_pw3 = A_pw2*A;
  double B_pw3 = B_pw2*B;
  double A_pw4 = A_pw3*A;
  double B_pw4 = B_pw3*B;

  double alpha = -3*B_pw2/(8*A_pw2)+C/A;
  double beta = B_pw3/(8*A_pw3)-B*C/(2*A_pw2)+D/A;
  double gamma = -3*B_pw4/(256*A_pw4)+B_pw2*C/(16*A_pw3)-B*D/(4*A_pw2)+E/A;

  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;

  std::complex<double> P (-alpha_pw2/12-gamma,0);
  std::complex<double> Q (-alpha_pw3/108+alpha*gamma/3-pow(beta,2)/8,0);
  std::complex<double> R = -Q/2.0+sqrt(pow(Q,2.0)/4.0+pow(P,3.0)/27.0);

  std::complex<double> U = pow(R,(1.0/3.0));
  std::complex<double> y;

  if (U.real() == 0)
    y = -5.0*alpha/6.0-pow(Q,(1.0/3.0));
  else
    y = -5.0*alpha/6.0-P/(3.0*U)+U;

  std::complex<double> w = sqrt(alpha+2.0*y);

  std::vector<double> realRoots;
  std::complex<double> temp;
  temp = -B/(4.0*A) + 0.5*(w+sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(w-sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w+sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w-sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());

  return realRoots;
}